

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

CommandSignature __thiscall
anon_unknown.dwarf_ecf33::ClangShellCommand::getSignature(ClangShellCommand *this)

{
  CommandSignature *pCVar1;
  CommandSignature local_20;
  ClangShellCommand *local_18;
  ClangShellCommand *this_local;
  
  local_18 = this;
  local_20 = llbuild::buildsystem::ExternalCommand::getSignature(&this->super_ExternalCommand);
  pCVar1 = llbuild::basic::CommandSignature::combine<llvm::StringRef>(&local_20,&this->args);
  return (CommandSignature)pCVar1->value;
}

Assistant:

virtual CommandSignature getSignature() const override {
    return ExternalCommand::getSignature()
        .combine(args);
  }